

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

bool __thiscall Opcode::AABBQuantizedTree::Build(AABBQuantizedTree *this,AABBTree *tree)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  AABBQuantizedNode *pAVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  AABBCollisionNode *linear;
  AABBQuantizedNode *pAVar9;
  AABBCollisionNode *pAVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float local_330;
  float local_32c;
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  float local_310;
  float local_30c;
  float local_308;
  float local_304;
  AABBQuantizedNode *local_2f0;
  AABBCollisionNode *local_2c0;
  udword Nb;
  float qe;
  uint uStack_270;
  bool FixMe;
  float qc;
  udword j;
  Point Min;
  Point Max;
  udword i_1;
  uintptr_t Data;
  Point EQuantCoeff;
  Point CQuantCoeff;
  udword nbe;
  udword nbc;
  udword i;
  Point EMax;
  Point CMax;
  udword CurID;
  AABBCollisionNode *Nodes;
  udword NbNodes;
  udword NbTriangles;
  AABBTree *tree_local;
  AABBQuantizedTree *this_local;
  
  if (tree == (AABBTree *)0x0) {
    this_local._7_1_ = false;
  }
  else if (tree->mTotalNbNodes == (tree->super_AABBTreeNode).mNbPrimitives * 2 - 1) {
    (this->super_AABBOptimizedTree).mNbNodes = tree->mTotalNbNodes;
    if (this->mNodes != (AABBQuantizedNode *)0x0) {
      pAVar9 = this->mNodes;
      if (pAVar9 != (AABBQuantizedNode *)0x0) {
        for (pAVar4 = pAVar9 + pAVar9[-1].mData; pAVar9 != pAVar4; pAVar4 = pAVar4 + -1) {
        }
        operator_delete__(&pAVar9[-1].mData,pAVar9[-1].mData * 0x18 + 8);
      }
      this->mNodes = (AABBQuantizedNode *)0x0;
    }
    uVar5 = CONCAT44(0,(this->super_AABBOptimizedTree).mNbNodes);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    uVar6 = SUB168(auVar1 * ZEXT816(0x20),0);
    uVar11 = uVar6 + 8;
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar6) {
      uVar11 = 0xffffffffffffffff;
    }
    puVar7 = (ulong *)operator_new__(uVar11);
    *puVar7 = uVar5;
    linear = (AABBCollisionNode *)(puVar7 + 1);
    if (uVar5 != 0) {
      local_2c0 = linear;
      do {
        local_2c0->mData = 0;
        local_2c0 = local_2c0 + 1;
      } while (local_2c0 != linear + uVar5);
    }
    if (linear == (AABBCollisionNode *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      CMax.y = 1.4013e-45;
      _BuildCollisionTree(linear,0,(udword *)&CMax.y,&tree->super_AABBTreeNode);
      uVar5 = CONCAT44(0,(this->super_AABBOptimizedTree).mNbNodes);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar5;
      uVar6 = SUB168(auVar2 * ZEXT816(0x18),0);
      uVar11 = uVar6 + 8;
      if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar6) {
        uVar11 = 0xffffffffffffffff;
      }
      puVar8 = (ulong *)operator_new__(uVar11);
      *puVar8 = uVar5;
      pAVar9 = (AABBQuantizedNode *)(puVar8 + 1);
      if (uVar5 != 0) {
        local_2f0 = pAVar9;
        do {
          local_2f0->mData = 0;
          local_2f0 = local_2f0 + 1;
        } while (local_2f0 != pAVar9 + uVar5);
      }
      this->mNodes = pAVar9;
      if (this->mNodes == (AABBQuantizedNode *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        EMax.y = -3.4028235e+38;
        EMax.z = -3.4028235e+38;
        CMax.x = -3.4028235e+38;
        nbc = 0xff7fffff;
        i = 0xff7fffff;
        EMax.x = -3.4028235e+38;
        for (nbe = 0; nbe < (this->super_AABBOptimizedTree).mNbNodes; nbe = nbe + 1) {
          if (EMax.y < ABS(linear[nbe].mAABB.mCenter.x)) {
            EMax.y = ABS(linear[nbe].mAABB.mCenter.x);
          }
          if (EMax.z < ABS(linear[nbe].mAABB.mCenter.y)) {
            EMax.z = ABS(linear[nbe].mAABB.mCenter.y);
          }
          if (CMax.x < ABS(linear[nbe].mAABB.mCenter.z)) {
            CMax.x = ABS(linear[nbe].mAABB.mCenter.z);
          }
          if ((float)nbc < ABS(linear[nbe].mAABB.mExtents.x)) {
            nbc = (udword)ABS(linear[nbe].mAABB.mExtents.x);
          }
          if ((float)i < ABS(linear[nbe].mAABB.mExtents.y)) {
            i = (udword)ABS(linear[nbe].mAABB.mExtents.y);
          }
          if (EMax.x < ABS(linear[nbe].mAABB.mExtents.z)) {
            EMax.x = ABS(linear[nbe].mAABB.mExtents.z);
          }
        }
        CQuantCoeff.y._0_1_ = 0xf;
        if ((gFixQuantized & 1U) == 0) {
          CQuantCoeff.y._0_1_ = 0x10;
        }
        if ((EMax.y != 0.0) || (NAN(EMax.y))) {
          local_304 = 32767.0 / EMax.y;
        }
        else {
          local_304 = 0.0;
        }
        if ((EMax.z != 0.0) || (NAN(EMax.z))) {
          local_308 = 32767.0 / EMax.z;
        }
        else {
          local_308 = 0.0;
        }
        if ((CMax.x != 0.0) || (NAN(CMax.x))) {
          local_30c = 32767.0 / CMax.x;
        }
        else {
          local_30c = 0.0;
        }
        if (((float)nbc != 0.0) || (NAN((float)nbc))) {
          local_310 = (float)((1 << CQuantCoeff.y._0_1_) + -1) / (float)nbc;
        }
        else {
          local_310 = 0.0;
        }
        if (((float)i != 0.0) || (NAN((float)i))) {
          local_314 = (float)((1 << CQuantCoeff.y._0_1_) + -1) / (float)i;
        }
        else {
          local_314 = 0.0;
        }
        if ((EMax.x != 0.0) || (NAN(EMax.x))) {
          local_318 = (float)((1 << CQuantCoeff.y._0_1_) + -1) / EMax.x;
        }
        else {
          local_318 = 0.0;
        }
        if ((local_304 != 0.0) || (NAN(local_304))) {
          local_31c = 1.0 / local_304;
        }
        else {
          local_31c = 0.0;
        }
        (this->mCenterCoeff).x = local_31c;
        if ((local_308 != 0.0) || (NAN(local_308))) {
          local_320 = 1.0 / local_308;
        }
        else {
          local_320 = 0.0;
        }
        (this->mCenterCoeff).y = local_320;
        if ((local_30c != 0.0) || (NAN(local_30c))) {
          local_324 = 1.0 / local_30c;
        }
        else {
          local_324 = 0.0;
        }
        (this->mCenterCoeff).z = local_324;
        if ((local_310 != 0.0) || (NAN(local_310))) {
          local_328 = 1.0 / local_310;
        }
        else {
          local_328 = 0.0;
        }
        (this->mExtentsCoeff).x = local_328;
        if ((local_314 != 0.0) || (NAN(local_314))) {
          local_32c = 1.0 / local_314;
        }
        else {
          local_32c = 0.0;
        }
        (this->mExtentsCoeff).y = local_32c;
        if ((local_318 != 0.0) || (NAN(local_318))) {
          local_330 = 1.0 / local_318;
        }
        else {
          local_330 = 0.0;
        }
        (this->mExtentsCoeff).z = local_330;
        for (Max.y = 0.0; (uint)Max.y < (this->super_AABBOptimizedTree).mNbNodes;
            Max.y = (float)((int)Max.y + 1)) {
          this->mNodes[(uint)Max.y].mAABB.mCenter[0] =
               (sword)(int)(linear[(uint)Max.y].mAABB.mCenter.x * local_304);
          this->mNodes[(uint)Max.y].mAABB.mCenter[1] =
               (sword)(int)(*(float *)((long)puVar7 + (ulong)(uint)Max.y * 0x20 + 0xc) * local_308);
          this->mNodes[(uint)Max.y].mAABB.mCenter[2] =
               (sword)(int)(*(float *)(puVar7 + (ulong)(uint)Max.y * 4 + 2) * local_30c);
          this->mNodes[(uint)Max.y].mAABB.mExtents[0] =
               (uword)(int)(*(float *)((long)puVar7 + (ulong)(uint)Max.y * 0x20 + 0x14) * local_310)
          ;
          this->mNodes[(uint)Max.y].mAABB.mExtents[1] =
               (uword)(int)(*(float *)(puVar7 + (ulong)(uint)Max.y * 4 + 3) * local_314);
          this->mNodes[(uint)Max.y].mAABB.mExtents[2] =
               (uword)(int)(*(float *)((long)puVar7 + (ulong)(uint)Max.y * 0x20 + 0x1c) * local_318)
          ;
          if ((gFixQuantized & 1U) != 0) {
            Min.y = linear[(uint)Max.y].mAABB.mCenter.x + linear[(uint)Max.y].mAABB.mExtents.x;
            Min.z = linear[(uint)Max.y].mAABB.mCenter.y + linear[(uint)Max.y].mAABB.mExtents.y;
            pAVar10 = linear + (uint)Max.y;
            qc = (pAVar10->mAABB).mCenter.x - linear[(uint)Max.y].mAABB.mExtents.x;
            j = (udword)((pAVar10->mAABB).mCenter.y - linear[(uint)Max.y].mAABB.mExtents.y);
            Min.x = (pAVar10->mAABB).mCenter.z - linear[(uint)Max.y].mAABB.mExtents.z;
            for (uStack_270 = 0; uStack_270 < 3; uStack_270 = uStack_270 + 1) {
              fVar12 = (float)(int)this->mNodes[(uint)Max.y].mAABB.mCenter[uStack_270] *
                       (&(this->mCenterCoeff).x)[uStack_270];
              bVar3 = true;
              do {
                fVar13 = (float)this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_270] *
                         (&(this->mExtentsCoeff).x)[uStack_270];
                if ((fVar12 + fVar13 < (&Min.y)[uStack_270]) ||
                   (fVar13 = fVar12 - fVar13,
                   (&qc)[uStack_270] <= fVar13 && fVar13 != (&qc)[uStack_270])) {
                  this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_270] =
                       this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_270] + 1;
                }
                else {
                  bVar3 = false;
                }
                if (this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_270] == 0) {
                  this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_270] = 0xffff;
                  bVar3 = false;
                }
              } while (bVar3);
            }
          }
          unique0x00012000 = (AABBQuantizedNode *)linear[(uint)Max.y].mData;
          if (((ulong)unique0x00012000 & 1) == 0) {
            register0x00000000 = this->mNodes + ((uint)((int)unique0x00012000 - (int)linear) >> 5);
          }
          this->mNodes[(uint)Max.y].mData = (uintptr_t)stack0xfffffffffffffdb0;
        }
        if ((linear != (AABBCollisionNode *)0x0) && (linear != (AABBCollisionNode *)0x0)) {
          for (pAVar10 = linear + *puVar7; linear != pAVar10; pAVar10 = pAVar10 + -1) {
          }
          operator_delete__(puVar7,*puVar7 * 0x20 + 8);
        }
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AABBQuantizedTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	mNbNodes = NbNodes;
	DELETEARRAY(mNodes);
	AABBCollisionNode* Nodes = new AABBCollisionNode[mNbNodes];
	CHECKALLOC(Nodes);

	// Build the tree
	udword CurID = 1;
	_BuildCollisionTree(Nodes, 0, CurID, tree);

	// Quantize
	{
		mNodes = new AABBQuantizedNode[mNbNodes];
		CHECKALLOC(mNodes);

		// Get max values
		FIND_MAX_VALUES

		// Quantization
		INIT_QUANTIZATION

		// Quantize
		uintptr_t Data;
		for(udword i=0;i<mNbNodes;i++)
		{
			PERFORM_QUANTIZATION
			REMAP_DATA(mData)
		}

		DELETEARRAY(Nodes);
	}

	return true;
}